

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  byte bVar8;
  ulong uVar9;
  undefined7 extraout_var;
  long *plVar10;
  undefined8 *puVar11;
  long lVar12;
  size_type *psVar13;
  long *plVar14;
  char *pcVar15;
  undefined8 uVar16;
  ulong uVar17;
  string e_2;
  string input;
  string output;
  string replace;
  string regex;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  RegularExpression re;
  string outvar;
  string local_268;
  string local_248;
  cmCommand *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_220;
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  local_198;
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  undefined1 local_170 [64];
  char *local_130 [13];
  char *local_c8;
  char *local_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  local_228 = &this->super_cmCommand;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_allocated_capacity = (size_type)&local_1e8;
  pcVar2 = pbVar1[3]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar2 = pbVar1[4]._M_dataplus._M_p;
  local_220 = args;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + pbVar1[4]._M_string_length);
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1f8._8_8_ != 0) {
    pcVar2 = local_170 + 8;
    uVar16 = 0;
    do {
      uVar9 = std::__cxx11::string::find(local_1f8._M_local_buf,0x51cbbe,uVar16);
      uVar3 = local_1f8._8_8_;
      if (uVar9 != 0xffffffffffffffff) {
        if (uVar9 != uVar16) {
          std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_1f8);
          local_180._0_4_ = 0xffffffff;
          local_178._M_p = pcVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,local_248._M_dataplus._M_p,
                     local_248._M_dataplus._M_p + local_248._M_string_length);
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_198,(RegexReplacement *)local_180);
          if (local_178._M_p != pcVar2) {
            operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
        }
        if (uVar9 == local_1f8._8_8_ - 1) {
          local_180 = (undefined1  [8])local_170;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_180,
                     "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.","");
          cmCommand::SetError(local_228,(string *)local_180);
          if (local_180 != (undefined1  [8])local_170) {
LAB_00289a37:
            operator_delete((void *)local_180,(ulong)(local_170._0_8_ + 1));
          }
        }
        else {
          bVar8 = ((char *)(local_1f8._M_allocated_capacity + 1))[uVar9];
          if (0x2f < (char)bVar8) {
            if (bVar8 < 0x3a) {
              local_180._0_4_ = (char)bVar8 + -0x30;
              local_170._0_8_ = (char *)0x0;
              local_170[8] = '\0';
              local_178._M_p = pcVar2;
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_180);
            }
            else if (bVar8 == 0x5c) {
              local_180._0_4_ = 0xffffffff;
              local_178._M_p = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\","");
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_180);
            }
            else {
              if (bVar8 != 0x6e) goto LAB_00289993;
              local_180._0_4_ = 0xffffffff;
              local_178._M_p = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\n","");
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_180);
            }
            if (local_178._M_p != pcVar2) {
              operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
            }
            uVar16 = uVar9 + 2;
            goto LAB_00289663;
          }
LAB_00289993:
          local_180 = (undefined1  [8])local_170;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_180,"sub-command REGEX, mode REPLACE: Unknown escape \"","");
          std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_1f8);
          std::__cxx11::string::_M_append(local_180,(ulong)local_248._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_180);
          cmCommand::SetError(local_228,(string *)local_180);
          if (local_180 != (undefined1  [8])local_170) goto LAB_00289a37;
        }
        bVar8 = 0;
        goto LAB_00289caa;
      }
      std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_1f8);
      local_180._0_4_ = 0xffffffff;
      local_178._M_p = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,local_248._M_dataplus._M_p,
                 local_248._M_dataplus._M_p + local_248._M_string_length);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::emplace_back<cmStringCommand::RegexReplacement>(&local_198,(RegexReplacement *)local_180);
      if (local_178._M_p != pcVar2) {
        operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
      }
      uVar16 = uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
LAB_00289663:
    } while ((ulong)uVar16 < (ulong)local_1f8._8_8_);
  }
  cmMakefile::ClearMatches(local_228->Makefile);
  local_c8 = (char *)0x0;
  bVar7 = cmsys::RegularExpression::compile
                    ((RegularExpression *)local_180,local_1b8._M_dataplus._M_p);
  if (bVar7) {
    local_218._0_8_ =
         (local_220->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 5;
    local_218._8_8_ =
         (local_220->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_248,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_218,&local_40);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_218._0_8_ = local_218 + 0x10;
    local_218._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218[0x10] = '\0';
    pcVar15 = (char *)0x0;
    while( true ) {
      bVar8 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_180,local_248._M_dataplus._M_p + (long)pcVar15);
      if (!(bool)bVar8) break;
      cmMakefile::StoreMatches(local_228->Makefile,(RegularExpression *)local_180);
      pcVar6 = local_b8;
      pcVar5 = local_130[0];
      auVar4 = local_180;
      local_220 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(local_220._4_4_,(int)CONCAT71(extraout_var,bVar8));
      std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_248);
      std::__cxx11::string::_M_append(local_218,(ulong)local_268._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1  [8])pcVar5 == auVar4) {
        std::operator+(&local_1d8,"sub-command REGEX, mode REPLACE regex \"",&local_1b8);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
        bVar8 = (byte)local_220;
        psVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_268.field_2._M_allocated_capacity = *psVar13;
          local_268.field_2._8_8_ = puVar11[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar13;
          local_268._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_268._M_string_length = puVar11[1];
        *puVar11 = psVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(local_228,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_00289c50:
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00289c5d;
      }
      if (local_198.
          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = 0;
        uVar17 = 1;
        do {
          lVar12 = (long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9].number;
          if (lVar12 < 0) {
            std::__cxx11::string::_M_append
                      (local_218,
                       (ulong)local_198.
                              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].value._M_dataplus.
                              _M_p);
          }
          else {
            if ((((*(long *)(local_180 + lVar12 * 8) - (long)local_b8 == 0xffffffffffffffff) ||
                 ((long)local_130[lVar12] - (long)local_b8 == 0xffffffffffffffff)) ||
                (local_248._M_string_length - (long)pcVar15 <
                 (ulong)(*(long *)(local_180 + lVar12 * 8) - (long)local_b8))) ||
               (local_248._M_string_length - (long)pcVar15 <
                (ulong)((long)local_130[lVar12] - (long)local_b8))) {
              std::operator+(&local_70,"sub-command REGEX, mode REPLACE: replace expression \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1f8);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_80 = *plVar14;
                lStack_78 = plVar10[3];
                local_90 = &local_80;
              }
              else {
                local_80 = *plVar14;
                local_90 = (long *)*plVar10;
              }
              local_88 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_90,(ulong)local_1b8._M_dataplus._M_p);
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1d8.field_2._M_allocated_capacity = *psVar13;
                local_1d8.field_2._8_8_ = plVar10[3];
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              }
              else {
                local_1d8.field_2._M_allocated_capacity = *psVar13;
                local_1d8._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1d8._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_1d8);
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_268.field_2._M_allocated_capacity = *psVar13;
                local_268.field_2._8_8_ = plVar10[3];
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
              }
              else {
                local_268.field_2._M_allocated_capacity = *psVar13;
                local_268._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_268._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              bVar8 = (byte)local_220;
              if (local_90 != &local_80) {
                operator_delete(local_90,local_80 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              cmCommand::SetError(local_228,&local_268);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p == &local_268.field_2) goto LAB_00289c5d;
              goto LAB_00289c50;
            }
            std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_248);
            std::__cxx11::string::_M_append(local_218,(ulong)local_268._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar9 = ((long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar7 = uVar17 <= uVar9;
          lVar12 = uVar9 - uVar17;
          uVar9 = uVar17;
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (bVar7 && lVar12 != 0);
      }
      pcVar15 = pcVar5 + ((long)pcVar15 - (long)pcVar6);
    }
    std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_248);
    std::__cxx11::string::_M_append(local_218,(ulong)local_268._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    cmMakefile::AddDefinition(local_228->Makefile,&local_b0,(char *)local_218._0_8_);
LAB_00289c5d:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    bVar8 = bVar8 ^ 1;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   "sub-command REGEX, mode REPLACE failed to compile regex \"",&local_1b8);
    plVar10 = (long *)std::__cxx11::string::append(local_218);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_248.field_2._M_allocated_capacity = *psVar13;
      local_248.field_2._8_8_ = plVar10[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar13;
      local_248._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_248._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
    }
    cmCommand::SetError(local_228,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    bVar8 = 0;
  }
  if (local_c8 != (char *)0x0) {
    operator_delete__(local_c8);
  }
LAB_00289caa:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar8;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string regex = args[2];
  std::string replace = args[3];
  std::string outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while(l < replace.length())
    {
    std::string::size_type r = replace.find("\\", l);
    if(r == std::string::npos)
      {
      r = replace.length();
      replacement.push_back(replace.substr(l, r-l));
      }
    else
      {
      if(r-l > 0)
        {
        replacement.push_back(replace.substr(l, r-l));
        }
      if(r == (replace.length()-1))
        {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
        }
      if((replace[r+1] >= '0') && (replace[r+1] <= '9'))
        {
        replacement.push_back(replace[r+1]-'0');
        }
      else if(replace[r+1] == 'n')
        {
        replacement.push_back("\n");
        }
      else if(replace[r+1] == '\\')
        {
        replacement.push_back("\\");
        }
      else
        {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
        }
      r += 2;
      }
    l = r;
    }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while(re.find(input.c_str()+base))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if(r-l2 == 0)
      {
      std::string e = "sub-command REGEX, mode REPLACE regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }

    // Concatenate the replacement for the match.
    for(unsigned int i=0; i < replacement.size(); ++i)
      {
      if(replacement[i].number < 0)
        {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
        }
      else
        {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length()-base;
        if((start != std::string::npos) && (end != std::string::npos) &&
           (start <= len) && (end <= len))
          {
          output += input.substr(base+start, end-start);
          }
        else
          {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \""+
            replace+"\" contains an out-of-range escape for regex \""+
            regex+"\".";
          this->SetError(e);
          return false;
          }
        }
      }

    // Move past the match.
    base += r;
    }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length()-base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}